

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O3

int lwsl_timestamp(int level,char *p,size_t len)

{
  int iVar1;
  tm *ptVar2;
  long lVar3;
  ulong uVar4;
  time_t o_now;
  timeval tv;
  tm tm;
  
  lVar3 = 0;
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  o_now = tv.tv_sec;
  uVar4 = (ulong)(uint)((int)(SUB168(SEXT816(tv.tv_usec) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 6) -
                       (SUB164(SEXT816(tv.tv_usec) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f)) +
          tv.tv_sec * 10000;
  ptVar2 = localtime_r(&o_now,(tm *)&tm);
  *p = '\0';
  do {
    if (1 << ((byte)lVar3 & 0x1f) == level) {
      if (ptVar2 != (tm *)0x0) {
        iVar1 = lws_snprintf(p,len,"[%04d/%02d/%02d %02d:%02d:%02d:%04d] %c: ",
                             (ulong)(ptVar2->tm_year + 0x76c),(ulong)(ptVar2->tm_mon + 1),
                             (ulong)(uint)ptVar2->tm_mday,(ulong)(uint)ptVar2->tm_hour,
                             (ulong)(uint)ptVar2->tm_min,(ulong)(uint)ptVar2->tm_sec,
                             (ulong)(uint)((int)uVar4 + (int)(uVar4 / 10000) * -10000),
                             (ulong)(uint)(int)"EWNIDPHXCLUT??"[lVar3]);
        return iVar1;
      }
      iVar1 = lws_snprintf(p,len,"[%llu:%04d] %c: ",uVar4 / 10000,
                           (ulong)(uint)((int)uVar4 + (int)(uVar4 / 10000) * -10000),
                           (ulong)(uint)(int)"EWNIDPHXCLUT??"[lVar3]);
      return iVar1;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 0xc);
  return 0;
}

Assistant:

int
lwsl_timestamp(int level, char *p, size_t len)
{
#if !defined(LWS_PLAT_OPTEE) && !defined(LWS_WITH_NO_LOGS)
	time_t o_now;
	unsigned long long now;
	struct timeval tv;
	struct tm *ptm = NULL;
#if defined(LWS_HAVE_LOCALTIME_R)
	struct tm tm;
#endif
	int n;

	gettimeofday(&tv, NULL);
	o_now = tv.tv_sec;
	now = ((unsigned long long)tv.tv_sec * 10000) +
				(unsigned int)(tv.tv_usec / 100);

#if defined(LWS_HAVE_LOCALTIME_R)
	ptm = localtime_r(&o_now, &tm);
#else
	ptm = localtime(&o_now);
#endif
	p[0] = '\0';
	for (n = 0; n < LLL_COUNT; n++) {
		if (level != (1 << n))
			continue;

		if (ptm)
			n = lws_snprintf(p, len,
				"[%04d/%02d/%02d %02d:%02d:%02d:%04d] %c: ",
				ptm->tm_year + 1900,
				ptm->tm_mon + 1,
				ptm->tm_mday,
				ptm->tm_hour,
				ptm->tm_min,
				ptm->tm_sec,
				(int)(now % 10000), log_level_names[n]);
		else
			n = lws_snprintf(p, len, "[%llu:%04d] %c: ",
					(unsigned long long) now / 10000,
					(int)(now % 10000), log_level_names[n]);
		return n;
	}
#else
	p[0] = '\0';
#endif

	return 0;
}